

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3443.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementShellANCF_3443::Calc_Sxi_zeta_compact
          (ChElementShellANCF_3443 *this,VectorN *Sxi_zeta_compact,double xi,double eta,double zeta,
          double thickness,double zoffset)

{
  (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_16,_1,_0,_16,_1>_>).m_storage.
  m_data.array[0] = 0.0;
  (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_16,_1,_0,_16,_1>_>).m_storage.
  m_data.array[1] = 0.0;
  (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_16,_1,_0,_16,_1>_>).m_storage.
  m_data.array[2] = 0.0;
  (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_16,_1,_0,_16,_1>_>).m_storage.
  m_data.array[3] = (eta + -1.0) * (xi + -1.0) * thickness * 0.125;
  (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_16,_1,_0,_16,_1>_>).m_storage.
  m_data.array[4] = 0.0;
  (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_16,_1,_0,_16,_1>_>).m_storage.
  m_data.array[5] = 0.0;
  (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_16,_1,_0,_16,_1>_>).m_storage.
  m_data.array[6] = 0.0;
  (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_16,_1,_0,_16,_1>_>).m_storage.
  m_data.array[7] = (xi + 1.0) * thickness * -0.125 * (eta + -1.0);
  (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_16,_1,_0,_16,_1>_>).m_storage.
  m_data.array[8] = 0.0;
  (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_16,_1,_0,_16,_1>_>).m_storage.
  m_data.array[9] = 0.0;
  (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_16,_1,_0,_16,_1>_>).m_storage.
  m_data.array[10] = 0.0;
  (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_16,_1,_0,_16,_1>_>).m_storage.
  m_data.array[0xb] = (eta + 1.0) * (xi + 1.0) * thickness * 0.125;
  (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_16,_1,_0,_16,_1>_>).m_storage.
  m_data.array[0xc] = 0.0;
  (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_16,_1,_0,_16,_1>_>).m_storage.
  m_data.array[0xd] = 0.0;
  (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_16,_1,_0,_16,_1>_>).m_storage.
  m_data.array[0xe] = 0.0;
  (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_16,_1,_0,_16,_1>_>).m_storage.
  m_data.array[0xf] = (eta + 1.0) * (xi + -1.0) * thickness * -0.125;
  return;
}

Assistant:

void ChElementShellANCF_3443::Calc_Sxi_zeta_compact(VectorN& Sxi_zeta_compact,
                                                    double xi,
                                                    double eta,
                                                    double zeta,
                                                    double thickness,
                                                    double zoffset) {
    Sxi_zeta_compact(0) = 0.0;
    Sxi_zeta_compact(1) = 0.0;
    Sxi_zeta_compact(2) = 0.0;
    Sxi_zeta_compact(3) = 0.125 * thickness * (xi - 1) * (eta - 1);

    Sxi_zeta_compact(4) = 0.0;
    Sxi_zeta_compact(5) = 0.0;
    Sxi_zeta_compact(6) = 0.0;
    Sxi_zeta_compact(7) = -0.125 * thickness * (xi + 1) * (eta - 1);

    Sxi_zeta_compact(8) = 0.0;
    Sxi_zeta_compact(9) = 0.0;
    Sxi_zeta_compact(10) = 0.0;
    Sxi_zeta_compact(11) = 0.125 * thickness * (xi + 1) * (eta + 1);

    Sxi_zeta_compact(12) = 0.0;
    Sxi_zeta_compact(13) = 0.0;
    Sxi_zeta_compact(14) = 0.0;
    Sxi_zeta_compact(15) = -0.125 * thickness * (xi - 1) * (eta + 1);
}